

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O1

bool __thiscall lunasvg::SVGAngle::parse(SVGAngle *this,string_view input)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  size_type __rlen;
  float value;
  float local_2c;
  string_view local_28;
  
  local_28._M_str = input._M_str;
  local_28._M_len = input._M_len;
  stripLeadingAndTrailingSpaces(&local_28);
  if (local_28._M_len == 0x12) {
    iVar2 = bcmp(local_28._M_str,"auto-start-reverse",0x12);
    if (iVar2 == 0) {
      *(undefined8 *)&(this->super_SVGProperty).field_0xc = 0x100000000;
      return true;
    }
  }
  else if ((local_28._M_len == 4) && (iVar2 = bcmp(local_28._M_str,"auto",4), iVar2 == 0)) {
    *(undefined8 *)&(this->super_SVGProperty).field_0xc = 0;
    return true;
  }
  local_2c = 0.0;
  bVar1 = parseNumber<float>(&local_28,&local_2c);
  __s1 = local_28._M_str;
  if (!bVar1) {
    return false;
  }
  if (local_28._M_len != 0) {
    if (local_28._M_len == 4) {
      iVar2 = bcmp(local_28._M_str,"grad",4);
      if (iVar2 == 0) {
        local_2c = local_2c * 0.9;
      }
      else {
        iVar2 = bcmp(__s1,"turn",4);
        if (iVar2 != 0) {
          return false;
        }
        local_2c = local_2c * 360.0;
      }
    }
    else {
      if (local_28._M_len != 3) {
        return false;
      }
      iVar2 = bcmp(local_28._M_str,"rad",3);
      if (iVar2 == 0) {
        local_2c = local_2c * 57.295776;
      }
      else {
        iVar2 = bcmp(__s1,"deg",3);
        if (iVar2 != 0) {
          return false;
        }
      }
    }
  }
  *(float *)&(this->super_SVGProperty).field_0xc = local_2c;
  this->m_orientType = Angle;
  return true;
}

Assistant:

bool SVGAngle::parse(std::string_view input)
{
    stripLeadingAndTrailingSpaces(input);
    if(input == "auto") {
        m_value = 0.f;
        m_orientType = OrientType::Auto;
        return true;
    }

    if(input == "auto-start-reverse") {
        m_value = 0.f;
        m_orientType = OrientType::AutoStartReverse;
        return true;
    }

    float value = 0.f;
    if(!parseNumber(input, value))
        return false;
    if(!input.empty()) {
        if(input == "rad")
            value *= 180.f / PLUTOVG_PI;
        else if(input == "grad")
            value *= 360.f / 400.f;
        else if(input == "turn")
            value *= 360.f;
        else if(input != "deg") {
            return false;
        }
    }

    m_value = value;
    m_orientType = OrientType::Angle;
    return true;
}